

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_thread_process.cpp
# Opt level: O0

void __thiscall sc_core::sc_thread_process::~sc_thread_process(sc_thread_process *this)

{
  pointer ppsVar1;
  sc_simcontext *this_00;
  sc_object *in_RDI;
  sc_process_b *in_stack_00000020;
  sc_thread_handle in_stack_ffffffffffffffc8;
  vector<sc_core::sc_process_monitor_*,_std::allocator<sc_core::sc_process_monitor_*>_>
  *in_stack_fffffffffffffff0;
  
  in_RDI->_vptr_sc_object = (_func_int **)&PTR_print_003652f0;
  if (in_RDI[3].m_child_events.
      super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    ppsVar1 = in_RDI[3].m_child_events.
              super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (**(code **)&(*ppsVar1)->field_0x10)(ppsVar1,0);
    ppsVar1 = in_RDI[3].m_child_events.
              super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppsVar1 != (pointer)0x0) {
      (**(code **)&(*ppsVar1)->field_0x8)();
    }
    in_RDI[3].m_child_events.
    super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  if (*(int *)((long)&in_RDI[1].m_child_events.
                      super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish + 4) != 2) {
    this_00 = sc_object::simcontext(in_RDI);
    sc_simcontext::remove_process(this_00,in_stack_ffffffffffffffc8);
  }
  std::vector<sc_core::sc_process_monitor_*,_std::allocator<sc_core::sc_process_monitor_*>_>::
  ~vector(in_stack_fffffffffffffff0);
  sc_process_b::~sc_process_b(in_stack_00000020);
  return;
}

Assistant:

sc_thread_process::~sc_thread_process()
{

    // DESTROY THE COROUTINE FOR THIS THREAD:

    if( m_cor_p != 0 ) {
        m_cor_p->stack_protect( false );
        delete m_cor_p;
        m_cor_p = 0;
    }

    // Remove from simcontext, if not spawned during simulation
    if( m_dynamic_proc != SPAWN_SIM ) {
        simcontext()->remove_process(this);
    }
}